

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

int allow_warp(MB_MODE_INFO *mbmi,WarpTypesAllowed *warp_types,WarpedMotionParams *gm_params,
              int build_for_obmc,scale_factors *sf,WarpedMotionParams *final_warp_params)

{
  int iVar1;
  int in_ECX;
  void *in_RDX;
  int *in_RSI;
  long in_RDI;
  scale_factors *in_R8;
  void *in_R9;
  int local_4;
  
  iVar1 = av1_is_scaled(in_R8);
  if (iVar1 == 0) {
    if (in_R9 != (void *)0x0) {
      memcpy(in_R9,&default_warp_params,0x24);
    }
    if (in_ECX == 0) {
      if ((in_RSI[1] == 0) || (*(char *)(in_RDI + 0x3d) != '\0')) {
        if ((*in_RSI == 0) || (*(char *)((long)in_RDX + 0x21) != '\0')) {
          local_4 = 0;
        }
        else {
          if (in_R9 != (void *)0x0) {
            memcpy(in_R9,in_RDX,0x24);
          }
          local_4 = 1;
        }
      }
      else {
        if (in_R9 != (void *)0x0) {
          memcpy(in_R9,(void *)(in_RDI + 0x1c),0x24);
        }
        local_4 = 1;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int allow_warp(const MB_MODE_INFO *const mbmi,
                      const WarpTypesAllowed *const warp_types,
                      const WarpedMotionParams *const gm_params,
                      int build_for_obmc, const struct scale_factors *const sf,
                      WarpedMotionParams *final_warp_params) {
  // Note: As per the spec, we must test the fixed point scales here, which are
  // at a higher precision (1 << 14) than the xs and ys in subpel_params (that
  // have 1 << 10 precision).
  if (av1_is_scaled(sf)) return 0;

  if (final_warp_params != NULL) *final_warp_params = default_warp_params;

  if (build_for_obmc) return 0;

  if (warp_types->local_warp_allowed && !mbmi->wm_params.invalid) {
    if (final_warp_params != NULL)
      memcpy(final_warp_params, &mbmi->wm_params, sizeof(*final_warp_params));
    return 1;
  } else if (warp_types->global_warp_allowed && !gm_params->invalid) {
    if (final_warp_params != NULL)
      memcpy(final_warp_params, gm_params, sizeof(*final_warp_params));
    return 1;
  }

  return 0;
}